

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

string * __thiscall
CoreML::rangeToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,int64_t min,int64_t max,bool useArrayFormat)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = local_198;
  if ((int)max == 0) {
    if (this != (CoreML *)min) {
      if (min < 0) {
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        pcVar2 = "...";
        goto LAB_001ffc73;
      }
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1,"...");
    }
    std::ostream::_M_insert<long>((long)poVar1);
  }
  else {
    poVar1 = std::operator<<(poVar1,"[");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    pcVar2 = "]";
LAB_001ffc73:
    std::operator<<(poVar1,pcVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string rangeToString(int64_t min, int64_t max, bool useArrayFormat = false) {
        std::stringstream ss;

        if (useArrayFormat) {
            ss << "[" << min << ", " << max << "]";
        } else {
            if (min == max) {
                ss << min;
            } else if (max < 0) {
                ss << min << "...";
            } else {
                ss << min << "..." << max;
            }
        }
        return ss.str();
    }